

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

void Imath_2_5::extractEuler<float>(Matrix33<float> *mat,float *rot)

{
  float fVar1;
  Vec2<float> local_28;
  Vec2<float> local_20;
  
  local_20.x = *(float *)((long)(mat->x + 0) + 0);
  local_20.y = *(float *)((long)(mat->x + 0) + 4);
  local_28 = *(Vec2<float> *)(mat->x + 1);
  Vec2<float>::normalize(&local_20);
  Vec2<float>::normalize(&local_28);
  fVar1 = atan2f(local_28.x,local_20.x);
  *rot = -fVar1;
  return;
}

Assistant:

void
extractEuler (const Matrix33<T> &mat, T &rot)
{
    //
    // Normalize the local x and y axes to remove scaling.
    //

    Vec2<T> i (mat[0][0], mat[0][1]);
    Vec2<T> j (mat[1][0], mat[1][1]);

    i.normalize();
    j.normalize();

    //
    // Extract the angle, rot.
    // 

    rot = - Math<T>::atan2 (j[0], i[0]);
}